

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * monster_test_local_MyGame_Example_json_parser_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_type,uint64_t *value,
                 int *aggregate)

{
  ulong *puVar1;
  char *pcVar2;
  size_t n_1;
  size_t n;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong *buf_00;
  char *mark_6;
  ulong uVar11;
  
  uVar3 = (long)end - (long)buf;
  if (uVar3 < 8) {
    uVar11 = 0;
    switch(uVar3) {
    case 7:
      uVar11 = (long)buf[6] << 8;
    case 6:
      uVar11 = uVar11 | (long)buf[5] << 0x10;
    case 5:
      uVar11 = uVar11 | (long)buf[4] << 0x18;
    case 4:
      uVar11 = uVar11 | (long)buf[3] << 0x20;
    case 3:
      uVar11 = uVar11 | (long)buf[2] << 0x28;
    case 2:
      uVar11 = uVar11 | (long)buf[1] << 0x30;
    case 1:
      uVar11 = uVar11 | (ulong)(byte)*buf << 0x38;
    }
  }
  else {
    uVar11 = *(ulong *)buf;
    uVar11 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
             uVar11 << 0x38;
  }
  if (uVar11 < 0x6865785f656e756d) {
    if (uVar11 < 0x436f6c6f72000000) {
      if ((uVar11 & 0x7fffff0000000000) == 0x416e790000000000) {
        pcVar2 = buf;
        if (3 < (long)uVar3) {
          pcVar2 = buf + (ulong)(buf[3] == '.') * 4;
        }
        if (pcVar2 != buf) {
          pcVar2 = MyGame_Example_Any_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
          return pcVar2;
        }
      }
    }
    else if ((uVar11 & 0x7fffff0000000000) == 0x466f6f0000000000) {
      pcVar2 = buf;
      if (3 < (long)uVar3) {
        pcVar2 = buf + (ulong)(buf[3] == '.') * 4;
      }
      if (pcVar2 != buf) {
        pcVar2 = MyGame_Example_Foo_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
        return pcVar2;
      }
    }
    else if ((uVar11 & 0x7fffffffff000000) == 0x436f6c6f72000000) {
      pcVar2 = buf;
      if ((5 < (long)uVar3) && (pcVar2 = buf + 6, buf[5] != '.')) {
        pcVar2 = buf;
      }
      if (pcVar2 != buf) {
        pcVar2 = MyGame_Example_Color_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
        return pcVar2;
      }
    }
  }
  else if (uVar11 < 0x696e745f656e756d) {
    if (uVar11 == 0x6865785f656e756d) {
      pcVar2 = buf;
      if (8 < (long)uVar3) {
        pcVar2 = buf + (ulong)(buf[8] == '.') * 9;
      }
      if (pcVar2 != buf) {
        pcVar2 = MyGame_Example_hex_enum_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
        return pcVar2;
      }
    }
  }
  else if (uVar11 < 0x6e65675f656e756d) {
    if (uVar11 == 0x696e745f656e756d) {
      pcVar2 = buf;
      if (8 < (long)uVar3) {
        pcVar2 = buf + (ulong)(buf[8] == '.') * 9;
      }
      if (pcVar2 != buf) {
        pcVar2 = MyGame_Example_int_enum_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
        return pcVar2;
      }
    }
  }
  else {
    pcVar2 = buf;
    if (uVar11 == 0x6e65675f656e756d) {
      if (8 < (long)uVar3) {
        pcVar2 = buf + (ulong)(buf[8] == '.') * 9;
      }
      if (pcVar2 != buf) {
        pcVar2 = MyGame_Example_neg_enum_parse_json_enum(ctx,pcVar2,end,value_type,value,aggregate);
        return pcVar2;
      }
    }
    if (uVar11 == 0x6e6f74656d707479) {
      puVar1 = (ulong *)(pcVar2 + 8);
      uVar3 = (long)end - (long)puVar1;
      if (uVar3 < 8) {
        uVar5 = 0;
        uVar6 = 0;
        uVar7 = 0;
        uVar8 = 0;
        uVar9 = 0;
        uVar10 = 0;
        uVar4 = 0;
        switch(uVar3) {
        case 7:
          uVar5 = (uint)(pcVar2[0xe] >> 7);
        case 6:
          uVar6 = uVar5 | (uint)(pcVar2[0xd] >> 7);
        case 5:
          uVar7 = uVar6 | (uint)(pcVar2[0xc] >> 7);
        case 4:
          uVar8 = uVar7 | (int)pcVar2[0xb];
        case 3:
          uVar9 = uVar8 | (uint)((ulong)((long)pcVar2[10] << 0x28) >> 0x20);
        case 2:
          uVar10 = uVar9 | (uint)((ulong)((long)pcVar2[9] << 0x30) >> 0x20);
        case 1:
          uVar4 = uVar10 | (uint)(((ulong)(byte)*puVar1 << 0x38) >> 0x20);
        }
      }
      else {
        uVar11 = *puVar1;
        uVar4 = (uint)(uVar11 >> 0x18) & 0xff | (uint)(uVar11 >> 8) & 0xff00 |
                (uint)(((uVar11 & 0xff00) << 0x28) >> 0x20) | (uint)((uVar11 << 0x38) >> 0x20);
      }
      if (uVar4 == 0x656e756d) {
        buf_00 = puVar1;
        if ((4 < (long)uVar3) && (buf_00 = (ulong *)(pcVar2 + 0xd), pcVar2[0xc] != '.')) {
          buf_00 = puVar1;
        }
        if (buf_00 != puVar1) {
          pcVar2 = MyGame_Example_notemptyenum_parse_json_enum
                             (ctx,(char *)buf_00,end,value_type,value,aggregate);
          return pcVar2;
        }
      }
    }
  }
  return buf;
}

Assistant:

static const char *monster_test_local_MyGame_Example_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_type, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x6865785f656e756d) { /* branch "hex_enum" */
        if (w < 0x436f6c6f72000000) { /* branch "Color" */
            if ((w & 0xffffff0000000000) == 0x416e790000000000) { /* "Any" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                if (buf != mark) {
                    buf = MyGame_Example_Any_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "Any" */
                return unmatched;
            } /* "Any" */
        } else { /* branch "Color" */
            if ((w & 0xffffff0000000000) == 0x466f6f0000000000) { /* "Foo" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                if (buf != mark) {
                    buf = MyGame_Example_Foo_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "Foo" */
                if ((w & 0xffffffffff000000) == 0x436f6c6f72000000) { /* "Color" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 5);
                    if (buf != mark) {
                        buf = MyGame_Example_Color_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "Color" */
                    return unmatched;
                } /* "Color" */
            } /* "Foo" */
        } /* branch "Color" */
    } else { /* branch "hex_enum" */
        if (w < 0x696e745f656e756d) { /* branch "int_enum" */
            if (w == 0x6865785f656e756d) { /* "hex_enum" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                if (buf != mark) {
                    buf = MyGame_Example_hex_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "hex_enum" */
                return unmatched;
            } /* "hex_enum" */
        } else { /* branch "int_enum" */
            if (w < 0x6e65675f656e756d) { /* branch "neg_enum" */
                if (w == 0x696e745f656e756d) { /* "int_enum" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                    if (buf != mark) {
                        buf = MyGame_Example_int_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "int_enum" */
                    return unmatched;
                } /* "int_enum" */
            } else { /* branch "neg_enum" */
                if (w == 0x6e65675f656e756d) { /* "neg_enum" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                    if (buf != mark) {
                        buf = MyGame_Example_neg_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        goto pfguard1;
                    }
                } else { /* "neg_enum" */
                    goto pfguard1;
                } /* "neg_enum" */
                goto endpfguard1;
pfguard1:
                if (w == 0x6e6f74656d707479) { /* descend "notempty" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffff00000000) == 0x656e756d00000000) { /* "enum" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 4);
                        if (buf != mark) {
                            buf = MyGame_Example_notemptyenum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "enum" */
                        return unmatched;
                    } /* "enum" */
                } else { /* descend "notempty" */
                    return unmatched;
                } /* descend "notempty" */
endpfguard1:
                (void)0;
            } /* branch "neg_enum" */
        } /* branch "int_enum" */
    } /* branch "hex_enum" */
    return buf;
}